

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmParseTree.cpp
# Opt level: O0

char16 * Wasm::WasmTypes::GetTypeName(WasmType type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16_t *pcStack_10;
  WasmType type_local;
  
  switch(type) {
  case Void:
    pcStack_10 = L"void";
    break;
  case FirstLocalType:
    pcStack_10 = L"i32";
    break;
  case I64:
    pcStack_10 = L"i64";
    break;
  case F32:
    pcStack_10 = L"f32";
    break;
  case F64:
    pcStack_10 = L"f64";
    break;
  case V128:
    Simd::EnsureSimdIsEnabled();
    pcStack_10 = L"m128";
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmParseTree.cpp"
                       ,0x7f,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    pcStack_10 = L"unknown";
    break;
  case Any:
    pcStack_10 = L"any";
  }
  return pcStack_10;
}

Assistant:

const char16 * GetTypeName(WasmType type)
{
    switch (type) {
    case WasmTypes::WasmType::Void: return _u("void");
    case WasmTypes::WasmType::I32: return _u("i32");
    case WasmTypes::WasmType::I64: return _u("i64");
    case WasmTypes::WasmType::F32: return _u("f32");
    case WasmTypes::WasmType::F64: return _u("f64");
#ifdef ENABLE_WASM_SIMD
    case WasmTypes::WasmType::V128: 
        Simd::EnsureSimdIsEnabled();
        return _u("m128");
#endif
    case WasmTypes::WasmType::Any: return _u("any");
    default: Assert(UNREACHED); break;
    }
    return _u("unknown");
}